

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O1

block_t * __thiscall
plot::detail::braille::block_t::over(block_t *__return_storage_ptr__,block_t *this,block_t *other)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  block_t *pbVar14;
  byte bVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  bVar10 = other->pixels;
  bVar11 = this->pixels;
  bVar12 = ~bVar11 & bVar10;
  bVar15 = ~bVar10 & bVar11;
  bVar13 = bVar11 & bVar10;
  iVar18 = (int)(char)(((bVar12 & 1) - ((char)bVar12 >> 7)) + (bVar12 >> 1 & 1) +
                       ((bVar12 >> 2 & 1) != 0) + (bVar12 >> 3 & 1) + ((bVar12 >> 4 & 1) != 0) +
                       (bVar12 >> 5 & 1) + ((bVar12 >> 6 & 1) != 0));
  iVar17 = (int)(char)(((bVar15 & 1) - ((char)bVar15 >> 7)) + (bVar15 >> 1 & 1) +
                       ((bVar15 >> 2 & 1) != 0) + (bVar15 >> 3 & 1) + ((bVar15 >> 4 & 1) != 0) +
                       (bVar15 >> 5 & 1) + ((bVar15 >> 6 & 1) != 0));
  iVar16 = (int)(char)(((bVar13 & 1) - ((char)bVar13 >> 7)) + (bVar13 >> 1 & 1) +
                       ((bVar13 >> 2 & 1) != 0) + (bVar13 >> 3 & 1) + ((bVar13 >> 4 & 1) != 0) +
                       (bVar13 >> 5 & 1) + ((bVar13 >> 6 & 1) != 0));
  fVar19 = (float)(iVar18 + iVar17 + iVar16);
  pfVar1 = &(other->color).a;
  pbVar14 = this;
  if (*pfVar1 != 0.0) {
    pbVar14 = other;
  }
  if (NAN(*pfVar1)) {
    pbVar14 = other;
  }
  fVar2 = (pbVar14->color).r;
  fVar3 = (pbVar14->color).g;
  fVar4 = (pbVar14->color).b;
  fVar5 = (pbVar14->color).a;
  pfVar1 = &(this->color).a;
  if (*pfVar1 != 0.0) {
    other = this;
  }
  if (NAN(*pfVar1)) {
    other = this;
  }
  fVar6 = (other->color).r;
  fVar7 = (other->color).g;
  fVar8 = (other->color).b;
  fVar9 = (other->color).a;
  fVar20 = 1.0 - fVar9;
  fVar21 = fVar20 * fVar5 + fVar9;
  fVar23 = (float)iVar18 / fVar19;
  fVar22 = (float)iVar17 / fVar19;
  fVar19 = (float)iVar16 / fVar19;
  (__return_storage_ptr__->color).r =
       ((fVar2 * fVar5 * fVar20 + fVar6 * fVar9) / fVar21) * fVar19 +
       fVar6 * fVar22 + fVar2 * fVar23;
  (__return_storage_ptr__->color).g =
       ((fVar3 * fVar5 * fVar20 + fVar7 * fVar9) / fVar21) * fVar19 +
       fVar7 * fVar22 + fVar3 * fVar23;
  (__return_storage_ptr__->color).b =
       ((fVar4 * fVar5 * fVar20 + fVar8 * fVar9) / fVar21) * fVar19 +
       fVar8 * fVar22 + fVar4 * fVar23;
  (__return_storage_ptr__->color).a = fVar19 * fVar21 + fVar22 * fVar9 + fVar23 * fVar5;
  __return_storage_ptr__->pixels = bVar11 | bVar10;
  return __return_storage_ptr__;
}

Assistant:

block_t over(block_t const& other) const {
            auto old = bitcount(other.pixels & ~pixels);
            auto new_ = bitcount(pixels & ~other.pixels);

            std::uint8_t over_pixels = other.pixels & pixels;
            auto over_ = bitcount(over_pixels);

            float total = old + new_ + over_;

            auto old_color = (other.color.a != 0.0f) ? other.color : color;
            auto new_color = (color.a != 0.0f) ? color : other.color;
            auto over_color = new_color.over(old_color);

            auto mixed_color = (old/total)*old_color + (new_/total)*new_color + (over_/total)*over_color;

            return { mixed_color, std::uint8_t(pixels | other.pixels) };
        }